

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O2

bool __thiscall ON_Geometry::Scale(ON_Geometry *this,double x)

{
  int iVar1;
  ON_Xform s;
  ON_Xform local_90;
  
  if ((x == 1.0) && (!NAN(x))) {
    return true;
  }
  if (1.23432101234321e+308 <= ABS(x)) {
    return false;
  }
  ON_Xform::DiagonalTransformation(&local_90,x);
  iVar1 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,&local_90);
  return SUB41(iVar1,0);
}

Assistant:

bool ON_Geometry::Scale( double x )
{
  if ( x == 1.0 )
    return true;
  if (false == ON_IS_VALID(x))
    return false;
  ON_Xform s(ON_Xform::DiagonalTransformation(x));
  return (0!=Transform( s ));
}